

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

int __thiscall
CVmObjByteArray::getp_digestMD5(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  vm_obj_id_t vVar5;
  ulong uVar6;
  long lVar7;
  size_t s2;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t s3;
  ulong uVar12;
  size_t avail;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  byte bVar18;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [16];
  uchar hash [16];
  char buf [32];
  md5_state_t ctx;
  ulong local_b8 [2];
  char local_a8 [32];
  md5_state_t local_88;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  if (oargc == (uint *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = *oargc;
  }
  if (getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_digestMD5();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_digestMD5::desc);
  if (iVar3 == 0) {
    uVar9 = (ulong)*(uint *)(this->super_CVmObject).ext_;
    uVar6 = uVar9;
    if (uVar8 == 0) {
      uVar12 = 1;
    }
    else {
      uVar4 = CVmBif::pop_int_val();
      if (uVar8 != 1) {
        iVar3 = CVmBif::pop_int_val();
        uVar6 = (ulong)iVar3;
      }
      uVar13 = (ulong)uVar4;
      if (uVar9 + 1 < (ulong)uVar4) {
        uVar13 = uVar9 + 1;
      }
      uVar12 = 1;
      if (0 < (int)uVar4) {
        uVar12 = uVar13;
      }
    }
    uVar9 = (uVar9 + 1) - uVar12;
    if ((long)uVar6 < (long)uVar9) {
      uVar9 = uVar6;
    }
    md5_init(&local_88);
    if ((-1 < (long)uVar6) && (0 < (long)uVar9)) {
      uVar12 = uVar12 - 1;
      uVar6 = (ulong)((uint)uVar12 & 0x7fff);
      uVar13 = 0x8000 - uVar6;
      do {
        uVar11 = uVar13;
        if (uVar9 < uVar13) {
          uVar11 = uVar9;
        }
        md5_append(&local_88,
                   (md5_byte_t *)
                   (*(long *)(*(long *)((this->super_CVmObject).ext_ + (uVar12 >> 0x1c) * 8 + 4) +
                             (ulong)((uint)(uVar12 >> 0xf) & 0x1fff) * 8) + uVar6),(int)uVar11);
        uVar10 = uVar9 - uVar11;
        bVar1 = (long)uVar11 <= (long)uVar9;
        uVar9 = uVar10;
      } while (uVar10 != 0 && bVar1);
    }
    md5_finish(&local_88,(md5_byte_t *)local_b8);
    lVar7 = 0;
    do {
      uVar6 = *(ulong *)((long)local_b8 + lVar7);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar6;
      auVar16._0_2_ = (ushort)uVar6 >> 4;
      auVar16._2_2_ = (ushort)(uVar6 >> 0x10) >> 4;
      auVar16._4_2_ = (ushort)(uVar6 >> 0x20) >> 4;
      auVar16._6_2_ = (ushort)(uVar6 >> 0x34);
      auVar16._8_8_ = 0;
      auVar16 = auVar16 & _DAT_002d56a0;
      bVar18 = (byte)uVar6;
      bVar29 = (byte)(uVar6 >> 8);
      bVar30 = (byte)(uVar6 >> 0x10);
      bVar31 = (byte)(uVar6 >> 0x18);
      bVar32 = (byte)(uVar6 >> 0x20);
      bVar33 = (byte)(uVar6 >> 0x28);
      bVar34 = (byte)(uVar6 >> 0x30);
      bVar2 = (byte)(uVar6 >> 0x38);
      auVar19[0] = -((byte)((bVar18 < 0xa0) * -0x60 | (bVar18 >= 0xa0) * bVar18) == bVar18);
      auVar19[1] = -((byte)((bVar29 < 0xa0) * -0x60 | (bVar29 >= 0xa0) * bVar29) == bVar29);
      auVar19[2] = -((byte)((bVar30 < 0xa0) * -0x60 | (bVar30 >= 0xa0) * bVar30) == bVar30);
      auVar19[3] = -((byte)((bVar31 < 0xa0) * -0x60 | (bVar31 >= 0xa0) * bVar31) == bVar31);
      auVar19[4] = -((byte)((bVar32 < 0xa0) * -0x60 | (bVar32 >= 0xa0) * bVar32) == bVar32);
      auVar19[5] = -((byte)((bVar33 < 0xa0) * -0x60 | (bVar33 >= 0xa0) * bVar33) == bVar33);
      auVar19[6] = -((byte)((bVar34 < 0xa0) * -0x60 | (bVar34 >= 0xa0) * bVar34) == bVar34);
      auVar19[7] = -((byte)((bVar2 < 0xa0) * -0x60 | (bVar2 >= 0xa0) * bVar2) == bVar2);
      auVar19[8] = 0xff;
      auVar19[9] = 0xff;
      auVar19[10] = 0xff;
      auVar19[0xb] = 0xff;
      auVar19[0xc] = 0xff;
      auVar19[0xd] = 0xff;
      auVar19[0xe] = 0xff;
      auVar20[0] = auVar16[0] + '7';
      auVar20[1] = auVar16[1] + '7';
      auVar20[2] = auVar16[2] + '7';
      auVar20[3] = auVar16[3] + '7';
      auVar20[4] = auVar16[4] + '7';
      auVar20[5] = auVar16[5] + '7';
      auVar20[6] = auVar16[6] + '7';
      auVar20[7] = auVar16[7] + '7';
      auVar20[8] = auVar16[8];
      auVar20[9] = auVar16[9];
      auVar20[10] = auVar16[10];
      auVar20[0xb] = auVar16[0xb];
      auVar20[0xc] = auVar16[0xc];
      auVar20[0xd] = auVar16[0xd];
      auVar20[0xe] = auVar16[0xe];
      auVar20 = ~auVar19 & (auVar16._0_15_ | s_00000000_002d56c0._0_15_) | auVar20 & auVar19;
      auVar14 = auVar14 & _DAT_002d56e0;
      auVar17[0] = -('\t' < auVar14[0]);
      auVar17[1] = -('\t' < auVar14[1]);
      auVar17[2] = -('\t' < auVar14[2]);
      auVar17[3] = -('\t' < auVar14[3]);
      auVar17[4] = -('\t' < auVar14[4]);
      auVar17[5] = -('\t' < auVar14[5]);
      auVar17[6] = -('\t' < auVar14[6]);
      auVar17[7] = -('\t' < auVar14[7]);
      auVar17[8] = -('\0' < auVar14[8]);
      auVar17[9] = -('\0' < auVar14[9]);
      auVar17[10] = -('\0' < auVar14[10]);
      auVar17[0xb] = -('\0' < auVar14[0xb]);
      auVar17[0xc] = -('\0' < auVar14[0xc]);
      auVar17[0xd] = -('\0' < auVar14[0xd]);
      auVar17[0xe] = -('\0' < auVar14[0xe]);
      auVar17[0xf] = -('\0' < auVar14[0xf]);
      auVar15[0] = auVar14[0] + '7';
      auVar15[1] = auVar14[1] + '7';
      auVar15[2] = auVar14[2] + '7';
      auVar15[3] = auVar14[3] + '7';
      auVar15[4] = auVar14[4] + '7';
      auVar15[5] = auVar14[5] + '7';
      auVar15[6] = auVar14[6] + '7';
      auVar15[7] = auVar14[7] + '7';
      auVar15[8] = auVar14[8];
      auVar15[9] = auVar14[9];
      auVar15[10] = auVar14[10];
      auVar15[0xb] = auVar14[0xb];
      auVar15[0xc] = auVar14[0xc];
      auVar15[0xd] = auVar14[0xd];
      auVar15[0xe] = auVar14[0xe];
      auVar15[0xf] = auVar14[0xf];
      auVar14 = ~auVar17 & (auVar14 | _s_00000000_002d56c0) | auVar15 & auVar17;
      auVar28._0_14_ = auVar20._0_14_;
      auVar28[0xe] = auVar20[7];
      auVar28[0xf] = auVar14[7];
      auVar27._14_2_ = auVar28._14_2_;
      auVar27._0_13_ = auVar20._0_13_;
      auVar27[0xd] = auVar14[6];
      auVar26._13_3_ = auVar27._13_3_;
      auVar26._0_12_ = auVar20._0_12_;
      auVar26[0xc] = auVar20[6];
      auVar25._12_4_ = auVar26._12_4_;
      auVar25._0_11_ = auVar20._0_11_;
      auVar25[0xb] = auVar14[5];
      auVar24._11_5_ = auVar25._11_5_;
      auVar24._0_10_ = auVar20._0_10_;
      auVar24[10] = auVar20[5];
      auVar23._10_6_ = auVar24._10_6_;
      auVar23._0_9_ = auVar20._0_9_;
      auVar23[9] = auVar14[4];
      auVar22._9_7_ = auVar23._9_7_;
      auVar22._0_8_ = auVar20._0_8_;
      auVar22[8] = auVar20[4];
      auVar21._8_8_ = auVar22._8_8_;
      auVar21[7] = auVar14[3];
      auVar21[6] = auVar20[3];
      auVar21[5] = auVar14[2];
      auVar21[4] = auVar20[2];
      auVar21[3] = auVar14[1];
      auVar21[2] = auVar20[1];
      auVar21[0] = auVar20[0];
      auVar21[1] = auVar14[0];
      *(undefined1 (*) [16])(local_a8 + lVar7 * 2) = auVar21;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x10);
    vVar5 = CVmObjString::create(0,local_a8,0x20);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar5;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_digestMD5(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(0, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the starting index and length */
    long cnt = get_element_count();
    long idx = argc >= 1 ? CVmBif::pop_int_val(vmg0_) : 1;
    long len = argc >= 2 ? CVmBif::pop_int_val(vmg0_) : cnt;

    /* limit the starting index to the available range */
    if (idx < 1)
        idx = 1;
    else if (idx > cnt + 1)
        idx = cnt + 1;

    /* limit the length to the range remaining */
    if (len < 0)
        len = 0;
    else if (len > cnt - idx + 1)
        len = cnt - idx + 1;

    /* set up the hash accumulator */
    md5_state_t ctx;
    md5_init(&ctx);

    /* feed the selected range of bytes into the hash */
    while (len > 0)
    {
        /* get the next chunk */
        size_t avail;
        unsigned char *p = get_ele_ptr(idx, &avail);

        /* use the whole chunk, up to the amount remaining in the request */
        size_t cur = (len < (long)avail ? (size_t)len : avail);

        /* feed this chunk into the hash */
        md5_append(&ctx, p, cur);

        /* deduct this chunk from the remaining length */
        len -= cur;
    }

    /* calculate the hash result */
    const int HASH_BYTES = 16;
    unsigned char hash[HASH_BYTES];
    md5_finish(&ctx, hash);

    /* convert the binary hash to printable hex digits */
    char buf[HASH_BYTES*2], *bufp = buf;
    for (int i = 0 ; i < HASH_BYTES ; ++i, bufp += 2)
        byte_to_xdigits(bufp, hash[i]);

    /* return the string */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, buf, HASH_BYTES*2));

    /* handled */
    return TRUE;
}